

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_NtkProfileCones(Wlc_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  uint local_30;
  uint local_2c;
  int nMults;
  int nAdders;
  int nNodes;
  int nFos;
  int nPis;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *p_local;
  
  pObj = (Wlc_Obj_t *)p;
  for (nFos = 0; iVar1 = nFos, iVar2 = Wlc_NtkCoNum((Wlc_Ntk_t *)pObj), iVar1 < iVar2;
      nFos = nFos + 1) {
    _nPis = Wlc_NtkCo((Wlc_Ntk_t *)pObj,nFos);
    Wlc_NtkMarkCone((Wlc_Ntk_t *)pObj,nFos,1,0,0);
    nMults = Wlc_NtkCountMarked((Wlc_Ntk_t *)pObj,&nNodes,&nAdders,(int *)&local_2c,(int *)&local_30
                               );
    printf("Cone %5d : ",(ulong)(uint)nFos);
    printf("PI = %4d  ",(ulong)(uint)nNodes);
    printf("FO = %4d  ",(ulong)(uint)nAdders);
    printf("Node = %6d  ",(ulong)(uint)nMults);
    printf("Add/Sub = %4d  ",(ulong)local_2c);
    printf("Mult = %4d  ",(ulong)local_30);
    printf("\n");
  }
  Wlc_NtkCleanMarks((Wlc_Ntk_t *)pObj);
  return;
}

Assistant:

void Wlc_NtkProfileCones( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, nPis, nFos, nNodes, nAdders, nMults;
    Wlc_NtkForEachCo( p, pObj, i )
    {
        Wlc_NtkMarkCone( p, i, 1, 0, 0 );
        nNodes = Wlc_NtkCountMarked( p, &nPis, &nFos, &nAdders, &nMults );
        printf( "Cone %5d : ", i );
        printf( "PI = %4d  ", nPis );
        printf( "FO = %4d  ", nFos );
        printf( "Node = %6d  ", nNodes );
        printf( "Add/Sub = %4d  ", nAdders );
        printf( "Mult = %4d  ", nMults );
        printf( "\n" );
    }
    Wlc_NtkCleanMarks( p );
}